

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O0

void __thiscall
embree::collide2::CollisionConstraint::solvePositionConstraint
          (CollisionConstraint *this,ClothModel *model,float timeStep,size_t iter)

{
  undefined8 uVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RSI;
  long in_RDI;
  float fVar4;
  ulong uVar5;
  ulong uVar6;
  float proj;
  value_type *q;
  __m128 mask;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(in_RSI + 200),
                      **(size_type **)(in_RDI + 0x10));
  if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
    pvVar3 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                       ((vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *)(in_RSI + 8),
                        **(size_type **)(in_RDI + 0x10));
    local_e8 = (float)*(undefined8 *)&pvVar3->field_0;
    fStack_e4 = (float)((ulong)*(undefined8 *)&pvVar3->field_0 >> 0x20);
    fStack_e0 = (float)*(undefined8 *)((long)&pvVar3->field_0 + 8);
    local_f8 = (float)*(undefined8 *)(in_RDI + 0x20);
    fStack_f4 = (float)((ulong)*(undefined8 *)(in_RDI + 0x20) >> 0x20);
    fStack_f0 = (float)*(undefined8 *)(in_RDI + 0x28);
    local_1b8 = (float)*(undefined8 *)(in_RDI + 0x30);
    fStack_1b4 = (float)((ulong)*(undefined8 *)(in_RDI + 0x30) >> 0x20);
    fStack_1b0 = (float)*(undefined8 *)(in_RDI + 0x38);
    fVar4 = ((local_e8 - local_f8) * local_1b8 + (fStack_e4 - fStack_f4) * fStack_1b4 +
            (fStack_e0 - fStack_f0) * fStack_1b0) - *(float *)(in_RDI + 0x40);
    if (fVar4 < -*(float *)(in_RDI + 0x40)) {
      uVar5 = *(ulong *)(in_RDI + 0x30) ^ 0x8000000080000000;
      uVar6 = *(ulong *)(in_RDI + 0x38) ^ 0x8000000080000000;
      local_188 = (float)uVar5;
      fStack_184 = (float)(uVar5 >> 0x20);
      fStack_180 = (float)uVar6;
      fStack_17c = (float)(uVar6 >> 0x20);
      uVar1 = *(undefined8 *)((long)&pvVar3->field_0 + 8);
      local_a8 = (float)*(undefined8 *)&pvVar3->field_0;
      fStack_a4 = (float)((ulong)*(undefined8 *)&pvVar3->field_0 >> 0x20);
      fStack_a0 = (float)uVar1;
      fStack_9c = (float)((ulong)uVar1 >> 0x20);
      *(ulong *)&pvVar3->field_0 =
           CONCAT44(fStack_a4 + fStack_184 * fVar4,local_a8 + local_188 * fVar4);
      *(ulong *)((long)&pvVar3->field_0 + 8) =
           CONCAT44(fStack_9c + fStack_17c * fVar4,fStack_a0 + fStack_180 * fVar4);
    }
  }
  return;
}

Assistant:

void CollisionConstraint::solvePositionConstraint (ClothModel & model, float timeStep, size_t iter) {

    if (0.f == model.m_inv_[bodyIDs_[0]]) {
        return;
    }

    auto & q = model.x_[bodyIDs_[0]];
    float proj = dot (q-x0_, n_) - d_;//(q.x - x0_.x) * n_.x + (q.y - x0_.y) * n_.y + (q.z - x0_.z) * n_.z - d_;
    if (proj < -d_) {
        q += -n_*proj;
    }
}